

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol_edge_state.cpp
# Opt level: O2

void MOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               bool is_velocity)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  BCRec *bcrec;
  double *pdVar11;
  pair<bool,_bool> pVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  double *pdVar44;
  long lVar45;
  double *pdVar46;
  double *pdVar47;
  double *pdVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  double *pdVar57;
  int iVar58;
  double *pdVar59;
  double *pdVar60;
  long lVar61;
  double *pdVar62;
  double *pdVar63;
  bool bVar64;
  bool bVar65;
  ulong uVar66;
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  ulong uVar75;
  double dVar76;
  ulong uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar80;
  double dVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  double *local_258;
  double *local_250;
  double *local_248;
  double *local_240;
  double *local_228;
  double *local_218;
  double *local_210;
  double *local_1e0;
  long local_1d8;
  double *local_1c8;
  long local_1b0;
  double *local_198;
  double *local_190;
  long local_148;
  double *local_140;
  double *local_130;
  double *local_128;
  double *local_110;
  double *local_e8;
  uint local_80;
  double *local_58;
  
  iVar1 = (domain->smallend).vect[0];
  lVar61 = (long)iVar1;
  iVar2 = (domain->bigend).vect[0];
  iVar3 = (domain->smallend).vect[1];
  lVar30 = (long)iVar3;
  iVar4 = (bx->bigend).vect[0];
  iVar39 = (bx->bigend).vect[1];
  lVar49 = (long)iVar39;
  uVar5 = (bx->btype).itype;
  iVar58 = (~uVar5 & 1) + iVar4;
  iVar39 = iVar39 + (uint)((uVar5 & 2) == 0);
  iVar28 = (domain->bigend).vect[1];
  lVar31 = (long)iVar28;
  iVar29 = (domain->smallend).vect[2];
  lVar32 = (long)iVar29;
  iVar6 = (domain->bigend).vect[2];
  lVar14 = (long)iVar6;
  iVar7 = (bx->smallend).vect[0];
  iVar40 = (bx->smallend).vect[1];
  lVar15 = (long)iVar40;
  iVar8 = (bx->smallend).vect[2];
  lVar16 = (long)iVar8;
  iVar13 = (bx->bigend).vect[2];
  lVar17 = (long)iVar13;
  iVar13 = iVar13 + (uint)((uVar5 & 4) == 0);
  bcrec = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  lVar45 = (long)iVar7;
  pVar12 = anon_unknown.dwarf_468a06::has_extdir_or_ho(bcrec,ncomp,0);
  if (((pVar12.first & iVar7 + -1 <= iVar1) == 0) &&
     ((((ushort)pVar12 >> 8 & 1) == 0 || (iVar58 < iVar2)))) {
    lVar42 = umac->jstride;
    lVar43 = umac->kstride;
    lVar55 = (long)(umac->begin).y;
    lVar56 = (long)(umac->begin).z;
    lVar18 = xedge->jstride;
    lVar41 = xedge->kstride;
    uVar50 = 0;
    if (0 < ncomp) {
      uVar50 = (ulong)(uint)ncomp;
    }
    lVar36 = (long)(umac->begin).x;
    uVar5 = (q->begin).z;
    local_1b0 = q->kstride;
    uVar27 = (q->begin).y;
    local_1d8 = q->jstride;
    local_80 = (q->begin).x;
    local_190 = q->p;
    local_148 = q->nstride;
    pdVar11 = umac->p;
    local_128 = xedge->p +
                ((lVar45 + (lVar16 - (xedge->begin).z) * lVar41 +
                           (lVar15 - (xedge->begin).y) * lVar18) - (long)(xedge->begin).x);
    lVar37 = xedge->nstride;
    lVar19 = (iVar2 + 1) - lVar45;
    local_130 = local_190 +
                ((lVar45 + (lVar16 - (int)uVar5) * local_1b0 + (lVar15 - (int)uVar27) * local_1d8) -
                (long)(int)local_80);
    for (uVar52 = 0; uVar52 != uVar50; uVar52 = uVar52 + 1) {
      lVar51 = uVar52 * local_148;
      pdVar23 = local_128;
      pdVar44 = pdVar11 + ((lVar45 + (lVar16 - lVar56) * lVar43 + (lVar15 - lVar55) * lVar42) -
                          lVar36);
      pdVar48 = local_130;
      for (lVar22 = lVar16; lVar22 <= lVar17; lVar22 = lVar22 + 1) {
        lVar20 = (lVar22 - (int)uVar5) * local_1b0;
        lVar33 = (lVar22 - lVar56) * lVar43;
        pdVar21 = pdVar23;
        pdVar46 = pdVar44;
        pdVar57 = pdVar48;
        for (lVar34 = lVar15; lVar34 <= lVar49; lVar34 = lVar34 + 1) {
          if (iVar7 <= iVar58) {
            lVar35 = (lVar34 - (int)uVar27) * local_1d8;
            iVar1 = d_bcrec_ptr[uVar52].bc[3];
            lVar53 = (lVar34 - lVar55) * lVar42;
            lVar54 = 0;
            do {
              dVar67 = pdVar57[lVar54];
              iVar24 = (int)lVar54;
              dVar72 = local_190[lVar51 + lVar20 + lVar35 + (int)(~local_80 + iVar7 + iVar24)];
              dVar73 = (dVar67 - dVar72) + (dVar67 - dVar72);
              dVar76 = local_190[lVar51 + lVar20 + lVar35 + (int)((iVar7 - local_80) + 1 + iVar24)]
                       - dVar67;
              dVar74 = dVar72 - local_190[lVar51 + lVar20 + lVar35 + (int)((iVar7 - local_80) + -2 +
                                                                          iVar24)];
              dVar76 = dVar76 + dVar76;
              dVar74 = dVar74 + dVar74;
              auVar86._0_8_ = ABS(dVar76);
              auVar86._8_8_ = ABS(dVar73);
              dVar71 = (local_190[lVar51 + lVar20 + lVar35 + (int)((iVar7 - local_80) + 1 + iVar24)]
                       - dVar72) * 0.5;
              dVar70 = (dVar67 - local_190[lVar51 + lVar20 + lVar35 + (int)((iVar7 - local_80) + -2
                                                                           + iVar24)]) * 0.5;
              uVar75 = -(ulong)(0.0 < dVar71);
              uVar66 = -(ulong)(0.0 < dVar70);
              auVar82._0_8_ = ABS(dVar71);
              auVar82._8_8_ = ABS(dVar70);
              auVar83._8_8_ = ABS(dVar74);
              auVar83._0_8_ = auVar86._8_8_;
              auVar83 = minpd(auVar82,auVar83);
              auVar86 = minpd(auVar86,auVar83);
              uVar77 = -(ulong)(0.0 < dVar73 * dVar76) & auVar86._0_8_;
              uVar80 = -(ulong)(0.0 < dVar73 * dVar74) & auVar86._8_8_;
              dVar76 = (double)(~uVar75 & (uVar77 ^ 0x8000000000000000) | uVar77 & uVar75) * -0.5 +
                       dVar67;
              dVar74 = (double)(~uVar66 & (uVar80 ^ 0x8000000000000000) | uVar80 & uVar66) * 0.5 +
                       dVar72;
              if (lVar61 - lVar45 == lVar54) {
                dVar67 = dVar76;
                dVar73 = dVar76;
                switch(d_bcrec_ptr[uVar52].bc[0]) {
                default:
                  goto switchD_00297666_caseD_0;
                case 1:
                  break;
                case 2:
                case 4:
                  if (((uVar52 == 0 && is_velocity) &&
                       0.0 <= pdVar11[lVar33 + lVar53 + (lVar61 - lVar36)]) &&
                     (dVar67 = 0.0, dVar73 = 0.0, dVar76 <= 0.0)) {
                    dVar67 = dVar76;
                    dVar73 = dVar76;
                  }
                  break;
                case 3:
                  dVar74 = dVar72;
                  dVar67 = dVar72;
                  dVar73 = dVar72;
                  if (uVar52 != 0 || !is_velocity) goto switchD_00297666_caseD_0;
                  break;
                case -1:
switchD_00297666_caseD_ffffffff:
                  dVar67 = 0.0;
                  dVar73 = 0.0;
                }
              }
              else {
                if (lVar19 == lVar54) {
                  switch(iVar1) {
                  case 1:
                  case 2:
                  case 4:
                    dVar76 = dVar74;
                    break;
                  case 3:
                    dVar76 = dVar67;
                    dVar73 = dVar67;
                    if (uVar52 == 0 && is_velocity) goto switchD_00297666_caseD_1;
                    break;
                  case -1:
                    goto switchD_00297666_caseD_ffffffff;
                  }
                }
switchD_00297666_caseD_0:
                dVar67 = dVar76;
                dVar73 = dVar74;
              }
switchD_00297666_caseD_1:
              dVar72 = dVar73;
              if ((lVar19 == lVar54) &&
                 ((((iVar1 == 4 || (iVar1 == 2)) &&
                   (dVar67 = dVar73,
                   (uVar52 == 0 && is_velocity) &&
                   pdVar11[lVar33 + lVar53 + ((iVar2 + 1) - lVar36)] <= 0.0)) &&
                  (dVar67 = 0.0, dVar72 = 0.0, 0.0 <= dVar73)))) {
                dVar67 = dVar73;
                dVar72 = dVar73;
              }
              dVar76 = dVar72;
              if ((pdVar46[lVar54] <= 1e-08) && (dVar76 = dVar67, -1e-08 <= pdVar46[lVar54])) {
                dVar76 = (dVar72 + dVar67) * 0.5;
              }
              pdVar21[lVar54] = dVar76;
              lVar54 = lVar54 + 1;
            } while ((iVar58 - iVar7) + 1 != (int)lVar54);
          }
          pdVar21 = pdVar21 + lVar18;
          pdVar46 = pdVar46 + lVar42;
          pdVar57 = pdVar57 + local_1d8;
        }
        pdVar23 = pdVar23 + lVar41;
        pdVar44 = pdVar44 + lVar43;
        pdVar48 = pdVar48 + local_1b0;
      }
      local_128 = local_128 + lVar37;
      local_130 = local_130 + local_148;
    }
  }
  else {
    uVar5 = (q->begin).z;
    lVar42 = umac->jstride;
    lVar43 = umac->kstride;
    lVar18 = (long)(umac->begin).x;
    lVar55 = (long)(umac->begin).y;
    lVar41 = (long)(umac->begin).z;
    uVar50 = 0;
    if (0 < ncomp) {
      uVar50 = (ulong)(uint)ncomp;
    }
    iVar24 = iVar2 + 1;
    local_1b0 = q->kstride;
    uVar27 = (q->begin).y;
    local_1d8 = q->jstride;
    local_80 = (q->begin).x;
    lVar56 = xedge->jstride;
    lVar37 = xedge->kstride;
    local_190 = q->p;
    local_148 = q->nstride;
    pdVar11 = umac->p;
    local_58 = xedge->p +
               ((lVar45 + (lVar15 - (xedge->begin).y) * lVar56 +
                          (lVar16 - (xedge->begin).z) * lVar37) - (long)(xedge->begin).x);
    lVar36 = xedge->nstride;
    lVar19 = iVar24 - lVar45;
    local_110 = local_190 +
                ((lVar45 + (lVar16 - (int)uVar5) * local_1b0 + (lVar15 - (int)uVar27) * local_1d8) -
                (long)(int)local_80);
    for (uVar52 = 0; uVar52 != uVar50; uVar52 = uVar52 + 1) {
      lVar51 = uVar52 * local_148;
      pdVar23 = local_58;
      pdVar44 = local_110;
      pdVar48 = pdVar11 + ((lVar45 + (lVar16 - lVar41) * lVar43 + (lVar15 - lVar55) * lVar42) -
                          lVar18);
      for (lVar22 = lVar16; lVar22 <= lVar17; lVar22 = lVar22 + 1) {
        lVar33 = (lVar22 - (int)uVar5) * local_1b0;
        lVar20 = (lVar22 - lVar41) * lVar43;
        pdVar21 = pdVar23;
        pdVar46 = pdVar44;
        pdVar57 = pdVar48;
        for (lVar34 = lVar15; lVar34 <= lVar49; lVar34 = lVar34 + 1) {
          if (iVar7 <= iVar58) {
            iVar9 = d_bcrec_ptr[uVar52].bc[0];
            iVar10 = d_bcrec_ptr[uVar52].bc[3];
            lVar35 = (lVar34 - (int)uVar27) * local_1d8;
            lVar53 = (lVar34 - lVar55) * lVar42;
            lVar54 = 0;
            do {
              if ((iVar9 == 3) && (lVar45 + lVar54 <= lVar61)) {
                dVar67 = local_190[lVar35 + lVar33 + (int)(~local_80 + iVar1) + lVar51];
              }
              else if ((iVar10 == 3) && ((long)iVar2 < lVar45 + lVar54)) {
                dVar67 = local_190[lVar35 + lVar33 + (int)(iVar24 - local_80) + lVar51];
              }
              else {
                dVar76 = pdVar46[lVar54 + -1];
                dVar72 = pdVar46[lVar54];
                iVar26 = (int)lVar54;
                dVar67 = local_190[lVar35 + lVar33 + lVar51 + (int)((iVar7 - local_80) + 1 + iVar26)
                                  ];
                if (lVar61 - lVar45 == lVar54 && iVar9 - 3U < 2) {
                  dVar74 = dVar76 * -4.0 + dVar72 * 3.0 + dVar67;
LAB_00296ddf:
                  dVar74 = dVar74 / 3.0;
                }
                else {
                  dVar74 = (dVar67 - dVar76) * 0.5;
                  if ((iVar9 == 4 || iVar10 == 3) && iVar2 - lVar45 == lVar54) {
                    dVar74 = (dVar67 * 4.0 + dVar72 * -3.0) - dVar76;
                    goto LAB_00296ddf;
                  }
                }
                dVar87 = (dVar72 - dVar76) + (dVar72 - dVar76);
                dVar70 = (dVar67 - dVar72) + (dVar67 - dVar72);
                dVar67 = ABS(dVar87);
                dVar71 = ABS(dVar70);
                dVar73 = ABS(dVar74);
                if (dVar67 <= ABS(dVar74)) {
                  dVar73 = dVar67;
                }
                if (dVar73 <= dVar71) {
                  dVar71 = dVar73;
                }
                uVar75 = -(ulong)(0.0 < dVar87 * dVar70) & (ulong)dVar71;
                dVar73 = local_190[lVar35 + lVar33 + lVar51 + (int)((iVar7 - local_80) + -2 + iVar26
                                                                   )];
                if ((iVar9 - 3U < 2) && ((iVar1 - iVar7) + 1 == iVar26)) {
                  dVar71 = dVar73 * -4.0 + dVar76 * 3.0 + dVar72;
LAB_00296ee2:
                  dVar71 = dVar71 / 3.0;
                }
                else {
                  dVar71 = (dVar72 - dVar73) * 0.5;
                  if ((iVar9 == 4 || iVar10 == 3) && iVar24 - iVar7 == iVar26) {
                    dVar71 = (dVar72 * 4.0 + dVar76 * -3.0) - dVar73;
                    goto LAB_00296ee2;
                  }
                }
                dVar81 = (double)(~-(ulong)(0.0 < dVar74) & (uVar75 ^ 0x8000000000000000) |
                                 -(ulong)(0.0 < dVar74) & uVar75) * -0.5 + dVar72;
                dVar73 = (dVar76 - dVar73) + (dVar76 - dVar73);
                dVar70 = ABS(dVar73);
                dVar74 = ABS(dVar71);
                if (dVar70 <= ABS(dVar71)) {
                  dVar74 = dVar70;
                }
                if (dVar74 <= dVar67) {
                  dVar67 = dVar74;
                }
                uVar75 = -(ulong)(0.0 < dVar87 * dVar73) & (ulong)dVar67;
                dVar76 = (double)(~-(ulong)(0.0 < dVar71) & (uVar75 ^ 0x8000000000000000) |
                                 -(ulong)(0.0 < dVar71) & uVar75) * 0.5 + dVar76;
                if (lVar61 - lVar45 != lVar54) {
                  if (lVar19 == lVar54) {
                    switch(iVar10) {
                    case 1:
                    case 2:
                    case 4:
                      goto switchD_00296fd7_caseD_1;
                    case 3:
                      if (uVar52 == 0 && is_velocity) {
                        dVar76 = dVar72;
                      }
                      goto LAB_0029701f;
                    case -1:
                      goto switchD_00296f72_caseD_ffffffff;
                    }
                  }
                  goto switchD_00296f72_caseD_0;
                }
                switch(iVar9) {
                case 1:
                  dVar76 = dVar81;
                default:
switchD_00296f72_caseD_0:
                  dVar72 = dVar81;
                  break;
                case 2:
                case 4:
                  dVar72 = dVar81;
                  dVar76 = dVar81;
                  if (((uVar52 == 0 && is_velocity) &&
                       0.0 <= pdVar11[lVar20 + lVar53 + (lVar61 - lVar18)]) &&
                     (dVar72 = 0.0, dVar76 = 0.0, dVar81 <= 0.0)) {
                    dVar72 = dVar81;
                    dVar76 = dVar81;
                  }
                  break;
                case 3:
                  dVar76 = local_190[lVar35 + lVar33 + lVar51 + (int)(~local_80 + iVar1)];
                  if (uVar52 != 0 || !is_velocity) goto switchD_00296f72_caseD_0;
switchD_00296fd7_caseD_1:
                  dVar72 = dVar76;
                  break;
                case -1:
switchD_00296f72_caseD_ffffffff:
                  dVar72 = 0.0;
                  dVar76 = 0.0;
                }
LAB_0029701f:
                dVar74 = dVar76;
                if (((lVar19 == lVar54) &&
                    (((iVar10 == 4 || (iVar10 == 2)) &&
                     (dVar72 = dVar76,
                     (uVar52 == 0 && is_velocity) &&
                     pdVar11[lVar20 + lVar53 + (iVar24 - lVar18)] <= 0.0)))) &&
                   (dVar72 = 0.0, dVar74 = 0.0, 0.0 <= dVar76)) {
                  dVar72 = dVar76;
                  dVar74 = dVar76;
                }
                dVar67 = dVar74;
                if ((pdVar57[lVar54] <= 1e-08) && (dVar67 = dVar72, -1e-08 <= pdVar57[lVar54])) {
                  dVar67 = (dVar74 + dVar72) * 0.5;
                }
              }
              pdVar21[lVar54] = dVar67;
              lVar54 = lVar54 + 1;
            } while ((iVar58 - iVar7) + 1 != (int)lVar54);
          }
          pdVar57 = pdVar57 + lVar42;
          pdVar46 = pdVar46 + local_1d8;
          pdVar21 = pdVar21 + lVar56;
        }
        pdVar48 = pdVar48 + lVar43;
        pdVar44 = pdVar44 + local_1b0;
        pdVar23 = pdVar23 + lVar37;
      }
      local_110 = local_110 + local_148;
      local_58 = local_58 + lVar36;
    }
  }
  pVar12 = anon_unknown.dwarf_468a06::has_extdir_or_ho(bcrec,ncomp,1);
  lVar61 = (long)(int)local_80;
  lVar42 = (long)(int)uVar27;
  lVar43 = (long)(int)uVar5;
  uVar25 = ~uVar27;
  if (((((ushort)pVar12 & 1) == 0) || (iVar3 < iVar40 + -1)) &&
     ((((ushort)pVar12 >> 8 & 1) == 0 || (iVar39 < iVar28)))) {
    lVar18 = vmac->jstride;
    lVar41 = vmac->kstride;
    iVar1 = (vmac->begin).x;
    iVar2 = (vmac->begin).y;
    iVar3 = (vmac->begin).z;
    lVar55 = yedge->jstride;
    lVar56 = yedge->kstride;
    lVar37 = yedge->nstride;
    uVar52 = 0;
    uVar50 = 0;
    if (0 < ncomp) {
      uVar50 = (ulong)(uint)ncomp;
    }
    iVar28 = (yedge->begin).y;
    pdVar11 = vmac->p;
    pdVar44 = yedge->p + (((lVar16 - (yedge->begin).z) * lVar56 + lVar45) - (long)(yedge->begin).x);
    pdVar23 = local_190 + (((lVar16 - lVar43) * local_1b0 + lVar45) - lVar61);
    lVar36 = local_1d8 * 8;
    for (; uVar52 != uVar50; uVar52 = uVar52 + 1) {
      local_250 = pdVar44;
      local_240 = pdVar11 + (((lVar16 - iVar3) * lVar41 + lVar45) - (long)iVar1);
      local_218 = pdVar23;
      for (lVar19 = lVar16; lVar22 = lVar15, lVar19 <= lVar17; lVar19 = lVar19 + 1) {
        while (lVar51 = lVar22, lVar51 <= iVar39) {
          if (iVar4 < iVar7) {
            lVar22 = lVar51 + 1;
          }
          else {
            iVar40 = d_bcrec_ptr[uVar52].bc[4];
            lVar34 = (lVar51 - iVar2) * lVar18 * 8;
            lVar20 = 0;
            do {
              dVar67 = *(double *)((long)local_218 + lVar20 * 8 + (lVar51 - lVar42) * lVar36);
              dVar72 = *(double *)
                        ((long)local_218 + lVar20 * 8 + (int)(uVar25 + (int)lVar51) * lVar36);
              dVar70 = (dVar67 - dVar72) + (dVar67 - dVar72);
              dVar76 = *(double *)
                        ((long)local_218 + lVar20 * 8 + (int)((int)(lVar51 + 1) - uVar27) * lVar36);
              dVar74 = *(double *)
                        ((long)local_218 + lVar20 * 8 + (int)(((int)lVar51 - uVar27) + -2) * lVar36)
              ;
              dVar73 = dVar76 - dVar67;
              dVar71 = dVar72 - dVar74;
              dVar73 = dVar73 + dVar73;
              dVar71 = dVar71 + dVar71;
              auVar68._0_8_ = ABS(dVar73);
              auVar68._8_8_ = ABS(dVar70);
              dVar76 = (dVar76 - dVar72) * 0.5;
              dVar74 = (dVar67 - dVar74) * 0.5;
              uVar75 = -(ulong)(0.0 < dVar76);
              uVar66 = -(ulong)(0.0 < dVar74);
              auVar84._0_8_ = ABS(dVar76);
              auVar84._8_8_ = ABS(dVar74);
              auVar78._8_8_ = ABS(dVar71);
              auVar78._0_8_ = auVar68._8_8_;
              auVar86 = minpd(auVar84,auVar78);
              auVar86 = minpd(auVar68,auVar86);
              uVar77 = -(ulong)(0.0 < dVar70 * dVar73) & auVar86._0_8_;
              uVar80 = -(ulong)(0.0 < dVar70 * dVar71) & auVar86._8_8_;
              dVar76 = (double)(~uVar75 & (uVar77 ^ 0x8000000000000000) | uVar77 & uVar75) * -0.5 +
                       dVar67;
              dVar74 = (double)(~uVar66 & (uVar80 ^ 0x8000000000000000) | uVar80 & uVar66) * 0.5 +
                       dVar72;
              if (lVar51 == lVar30) {
                dVar67 = dVar76;
                dVar73 = dVar76;
                switch(d_bcrec_ptr[uVar52].bc[1]) {
                case 1:
                  break;
                case 2:
                case 4:
                  if (((uVar52 == 1 && is_velocity) &&
                       0.0 <= *(double *)((long)local_240 + lVar20 * 8 + lVar34)) &&
                     (dVar67 = 0.0, dVar73 = 0.0, dVar76 <= 0.0)) {
                    dVar67 = dVar76;
                    dVar73 = dVar76;
                  }
                  break;
                case 3:
                  dVar74 = dVar72;
                  if (uVar52 == 1 && is_velocity) {
                    dVar76 = dVar72;
                  }
                default:
                  dVar67 = dVar76;
                  dVar73 = dVar74;
                  break;
                case -1:
                  dVar67 = 0.0;
                  dVar73 = 0.0;
                }
                dVar76 = dVar67;
                dVar74 = dVar73;
                if (lVar51 == lVar31 + 1) goto switchD_0029853b_caseD_0;
              }
              else {
                dVar73 = dVar74;
                if (lVar51 == lVar31 + 1) {
                  switch(iVar40) {
                  case 1:
                  case 2:
                  case 4:
                    dVar76 = dVar74;
                  default:
switchD_0029853b_caseD_0:
                    dVar73 = dVar74;
                    if ((((iVar40 == 4) || (iVar40 == 2)) &&
                        (dVar76 = dVar74,
                        (uVar52 == 1 && is_velocity) &&
                        *(double *)((long)local_240 + lVar20 * 8 + lVar34) <= 0.0)) &&
                       (dVar76 = 0.0, dVar73 = 0.0, 0.0 <= dVar74)) {
                      dVar76 = dVar74;
                      dVar73 = dVar74;
                    }
                    break;
                  case 3:
                    dVar76 = dVar67;
                    if (uVar52 == 1 && is_velocity) {
                      dVar73 = dVar67;
                    }
                    break;
                  case -1:
                    dVar76 = 0.0;
                    dVar73 = 0.0;
                  }
                }
              }
              dVar67 = *(double *)((long)local_240 + lVar20 * 8 + lVar34);
              dVar72 = dVar73;
              if ((dVar67 <= 1e-08) && (dVar72 = dVar76, -1e-08 <= dVar67)) {
                dVar72 = (dVar73 + dVar76) * 0.5;
              }
              *(double *)((long)local_250 + lVar20 * 8 + (lVar51 - iVar28) * lVar55 * 8) = dVar72;
              lVar20 = lVar20 + 1;
              lVar22 = lVar51 + 1;
            } while ((iVar4 - iVar7) + 1 != (int)lVar20);
          }
        }
        local_240 = local_240 + lVar41;
        local_250 = local_250 + lVar56;
        local_218 = local_218 + local_1b0;
      }
      pdVar44 = pdVar44 + lVar37;
      pdVar23 = pdVar23 + local_148;
    }
  }
  else {
    lVar18 = vmac->jstride;
    lVar41 = vmac->kstride;
    iVar1 = (vmac->begin).x;
    iVar2 = (vmac->begin).y;
    iVar40 = (vmac->begin).z;
    lVar55 = yedge->jstride;
    lVar56 = yedge->kstride;
    uVar50 = 0;
    if (0 < ncomp) {
      uVar50 = (ulong)(uint)ncomp;
    }
    iVar24 = iVar28 + 1;
    pdVar11 = vmac->p;
    lVar37 = (lVar16 - lVar43) * local_1b0;
    lVar36 = yedge->nstride;
    pdVar44 = yedge->p + (((lVar16 - (yedge->begin).z) * lVar56 + lVar45) - (long)(yedge->begin).x);
    iVar58 = (yedge->begin).y;
    pdVar21 = local_190 + (((int)(iVar24 - uVar27) * local_1d8 + lVar37 + lVar45) - lVar61);
    pdVar23 = local_190 + ((lVar37 + lVar45) - lVar61);
    pdVar48 = local_190 + (((int)(iVar3 + uVar25) * local_1d8 + lVar37 + lVar45) - lVar61);
    lVar37 = local_1d8 * 8;
    for (uVar52 = 0; uVar52 != uVar50; uVar52 = uVar52 + 1) {
      pdVar46 = pdVar48;
      local_250 = pdVar21;
      local_210 = pdVar44;
      local_1e0 = pdVar11 + (((lVar16 - iVar40) * lVar41 + lVar45) - (long)iVar1);
      local_1c8 = pdVar23;
      for (lVar19 = lVar16; lVar22 = lVar15, lVar19 <= lVar17; lVar19 = lVar19 + 1) {
        while (lVar51 = lVar22, lVar51 <= iVar39) {
          if (iVar4 < iVar7) {
            lVar22 = lVar51 + 1;
          }
          else {
            iVar9 = d_bcrec_ptr[uVar52].bc[1];
            iVar10 = d_bcrec_ptr[uVar52].bc[4];
            bVar65 = iVar10 == 3;
            bVar64 = 1 < iVar9 - 3U;
            iVar26 = (int)(lVar51 + -1);
            lVar34 = (lVar51 - iVar2) * lVar18 * 8;
            lVar20 = 0;
            do {
              if (lVar30 < lVar51 || iVar9 != 3) {
                if (lVar31 < lVar51 && bVar65) {
                  dVar67 = local_250[lVar20];
                }
                else {
                  dVar67 = *(double *)((long)local_1c8 + lVar20 * 8 + (lVar51 - lVar42) * lVar37);
                  dVar76 = *(double *)
                            ((long)local_1c8 + lVar20 * 8 + ((lVar51 + -1) - lVar42) * lVar37);
                  dVar72 = *(double *)
                            ((long)local_1c8 +
                            lVar20 * 8 + (int)((int)(lVar51 + 1) - uVar27) * lVar37);
                  if (lVar51 != lVar30 || bVar64) {
                    dVar74 = (dVar72 - dVar76) * 0.5;
                    if (lVar51 == lVar31 && (iVar9 == 4 || bVar65)) {
                      dVar74 = (dVar72 * 4.0 + dVar67 * -3.0) - dVar76;
                      goto LAB_00297d9f;
                    }
                  }
                  else {
                    dVar74 = dVar76 * -4.0 + dVar67 * 3.0 + dVar72;
LAB_00297d9f:
                    dVar74 = dVar74 / 3.0;
                  }
                  dVar70 = (dVar67 - dVar76) + (dVar67 - dVar76);
                  dVar87 = (dVar72 - dVar67) + (dVar72 - dVar67);
                  dVar72 = ABS(dVar70);
                  dVar71 = ABS(dVar87);
                  dVar73 = ABS(dVar74);
                  if (dVar72 <= ABS(dVar74)) {
                    dVar73 = dVar72;
                  }
                  if (dVar73 <= dVar71) {
                    dVar71 = dVar73;
                  }
                  uVar75 = -(ulong)(0.0 < dVar70 * dVar87) & (ulong)dVar71;
                  dVar73 = *(double *)
                            ((long)local_1c8 +
                            lVar20 * 8 + (int)(((int)lVar51 - uVar27) + -2) * lVar37);
                  if (iVar3 != iVar26 || bVar64) {
                    dVar71 = (dVar67 - dVar73) * 0.5;
                    if (iVar28 == iVar26 && (iVar9 == 4 || bVar65)) {
                      dVar71 = (dVar67 * 4.0 + dVar76 * -3.0) - dVar73;
                      goto LAB_00297e80;
                    }
                  }
                  else {
                    dVar71 = dVar73 * -4.0 + dVar76 * 3.0 + dVar67;
LAB_00297e80:
                    dVar71 = dVar71 / 3.0;
                  }
                  dVar87 = (double)(~-(ulong)(0.0 < dVar74) & (uVar75 ^ 0x8000000000000000) |
                                   -(ulong)(0.0 < dVar74) & uVar75) * -0.5 + dVar67;
                  dVar73 = (dVar76 - dVar73) + (dVar76 - dVar73);
                  dVar81 = ABS(dVar73);
                  dVar74 = ABS(dVar71);
                  if (dVar81 <= ABS(dVar71)) {
                    dVar74 = dVar81;
                  }
                  if (dVar74 <= dVar72) {
                    dVar72 = dVar74;
                  }
                  uVar75 = -(ulong)(0.0 < dVar70 * dVar73) & (ulong)dVar72;
                  dVar76 = (double)(~-(ulong)(0.0 < dVar71) & (uVar75 ^ 0x8000000000000000) |
                                   -(ulong)(0.0 < dVar71) & uVar75) * 0.5 + dVar76;
                  if (lVar51 == lVar30) {
                    switch(iVar9) {
                    case 1:
switchD_00297f1e_caseD_1:
                      dVar76 = dVar87;
                      break;
                    case 2:
                    case 4:
                      if ((uVar52 != 1 || !is_velocity) ||
                          *(double *)((long)local_1e0 + lVar20 * 8 + lVar34) < 0.0)
                      goto switchD_00297f1e_caseD_1;
                      dVar76 = 0.0;
                      if (dVar87 <= 0.0) {
                        dVar76 = dVar87;
                      }
LAB_00297fb2:
                      dVar87 = dVar76;
                      break;
                    case 3:
                      dVar76 = *(double *)
                                ((long)local_1c8 + lVar20 * 8 + (int)(uVar25 + (int)lVar51) * lVar37
                                );
                      if (uVar52 == 1 && is_velocity) goto LAB_00297fb2;
                      break;
                    case -1:
                      dVar76 = 0.0;
                      dVar87 = 0.0;
                    }
                    if (lVar51 == iVar24) {
LAB_00297fc7:
                      if (((iVar10 == 4) || (iVar10 == 2)) &&
                         (dVar87 = dVar76,
                         (uVar52 == 1 && is_velocity) &&
                         *(double *)((long)local_1e0 + lVar20 * 8 + lVar34) <= 0.0)) {
                        dVar67 = 0.0;
                        if (0.0 <= dVar76) {
                          dVar67 = dVar76;
                        }
LAB_00298006:
                        dVar87 = dVar67;
                        dVar76 = dVar67;
                      }
                    }
                  }
                  else if (lVar51 == iVar24) {
                    switch(iVar10) {
                    case 1:
                    case 2:
                    case 4:
                      dVar87 = dVar76;
                    default:
                      goto LAB_00297fc7;
                    case 3:
                      dVar87 = dVar67;
                      if (uVar52 != 1 || !is_velocity) break;
                      goto LAB_00298006;
                    case -1:
                      dVar76 = 0.0;
                      dVar87 = 0.0;
                    }
                  }
                  dVar72 = *(double *)((long)local_1e0 + lVar20 * 8 + lVar34);
                  dVar67 = dVar76;
                  if ((dVar72 <= 1e-08) && (dVar67 = dVar87, -1e-08 <= dVar72)) {
                    dVar67 = (dVar76 + dVar87) * 0.5;
                  }
                }
              }
              else {
                dVar67 = pdVar46[lVar20];
              }
              *(double *)((long)local_210 + lVar20 * 8 + (lVar51 - iVar58) * lVar55 * 8) = dVar67;
              lVar20 = lVar20 + 1;
              lVar22 = lVar51 + 1;
            } while ((iVar4 - iVar7) + 1 != (int)lVar20);
          }
        }
        local_1e0 = local_1e0 + lVar41;
        local_210 = local_210 + lVar56;
        local_250 = local_250 + local_1b0;
        local_1c8 = local_1c8 + local_1b0;
        pdVar46 = pdVar46 + local_1b0;
      }
      pdVar44 = pdVar44 + lVar36;
      pdVar21 = pdVar21 + local_148;
      pdVar23 = pdVar23 + local_148;
      pdVar48 = pdVar48 + local_148;
    }
  }
  pVar12 = anon_unknown.dwarf_468a06::has_extdir_or_ho(bcrec,ncomp,2);
  uVar27 = ~uVar5;
  if (((((ushort)pVar12 & 1) == 0) || (iVar29 < iVar8 + -1)) &&
     ((((ushort)pVar12 >> 8 & 1) == 0 || (iVar13 < iVar6)))) {
    lVar17 = wmac->jstride;
    lVar30 = wmac->kstride;
    iVar1 = (wmac->begin).x;
    iVar2 = (wmac->begin).y;
    iVar3 = (wmac->begin).z;
    uVar52 = 0;
    uVar50 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar50 = 0;
    }
    lVar18 = zedge->jstride;
    pdVar11 = wmac->p;
    lVar41 = zedge->kstride;
    lVar55 = (lVar15 - lVar42) * local_1d8;
    pdVar23 = zedge->p +
              ((lVar45 + (lVar16 - (zedge->begin).z) * lVar41 + (lVar15 - (zedge->begin).y) * lVar18
               ) - (long)(zedge->begin).x);
    lVar42 = zedge->nstride;
    local_228 = local_190 + ((lVar55 + lVar45) - lVar61);
    lVar31 = local_1b0 * 8;
    local_190 = local_190 + (((lVar16 - lVar43) * local_1b0 + lVar55 + lVar45) - lVar61);
    for (; uVar52 != uVar50; uVar52 = uVar52 + 1) {
      pdVar44 = pdVar11 + ((lVar45 + (lVar16 - iVar3) * lVar30 + (lVar15 - iVar2) * lVar17) -
                          (long)iVar1);
      pdVar48 = local_190;
      lVar61 = lVar16;
      pdVar21 = pdVar23;
      iVar28 = (iVar8 - uVar5) + -2;
      iVar29 = uVar27 + iVar8;
      iVar39 = iVar8 - uVar5;
      while (iVar39 = iVar39 + 1, lVar61 <= iVar13) {
        pdVar63 = (double *)(iVar28 * lVar31 + (long)local_228);
        pdVar47 = (double *)(iVar39 * lVar31 + (long)local_228);
        pdVar38 = (double *)(iVar29 * lVar31 + (long)local_228);
        pdVar46 = pdVar44;
        pdVar57 = pdVar48;
        pdVar59 = pdVar21;
        for (lVar43 = lVar15; lVar43 <= lVar49; lVar43 = lVar43 + 1) {
          if (iVar7 <= iVar4) {
            iVar6 = d_bcrec_ptr[uVar52].bc[5];
            lVar55 = 0;
            do {
              dVar67 = pdVar57[lVar55];
              dVar72 = pdVar38[lVar55];
              dVar73 = (dVar67 - dVar72) + (dVar67 - dVar72);
              dVar76 = pdVar47[lVar55] - dVar67;
              dVar74 = dVar72 - pdVar63[lVar55];
              dVar76 = dVar76 + dVar76;
              dVar74 = dVar74 + dVar74;
              auVar69._0_8_ = ABS(dVar76);
              auVar69._8_8_ = ABS(dVar73);
              dVar71 = (pdVar47[lVar55] - dVar72) * 0.5;
              dVar70 = (dVar67 - pdVar63[lVar55]) * 0.5;
              uVar75 = -(ulong)(0.0 < dVar71);
              uVar66 = -(ulong)(0.0 < dVar70);
              auVar85._0_8_ = ABS(dVar71);
              auVar85._8_8_ = ABS(dVar70);
              auVar79._8_8_ = ABS(dVar74);
              auVar79._0_8_ = auVar69._8_8_;
              auVar86 = minpd(auVar85,auVar79);
              auVar86 = minpd(auVar69,auVar86);
              uVar77 = -(ulong)(0.0 < dVar73 * dVar76) & auVar86._0_8_;
              uVar80 = -(ulong)(0.0 < dVar73 * dVar74) & auVar86._8_8_;
              dVar76 = (double)(~uVar75 & (uVar77 ^ 0x8000000000000000) | uVar77 & uVar75) * -0.5 +
                       dVar67;
              dVar74 = (double)(~uVar66 & (uVar80 ^ 0x8000000000000000) | uVar80 & uVar66) * 0.5 +
                       dVar72;
              if (lVar61 == lVar32) {
                dVar67 = dVar76;
                dVar73 = dVar76;
                switch(d_bcrec_ptr[uVar52].bc[2]) {
                case 1:
                  break;
                case 2:
                case 4:
                  if (((uVar52 == 2 && is_velocity) && 0.0 <= pdVar46[lVar55]) &&
                     (dVar67 = 0.0, dVar73 = 0.0, dVar76 <= 0.0)) {
                    dVar67 = dVar76;
                    dVar73 = dVar76;
                  }
                  break;
                case 3:
                  dVar74 = dVar72;
                  if (uVar52 == 2 && is_velocity) {
                    dVar76 = dVar72;
                  }
                default:
                  dVar67 = dVar76;
                  dVar73 = dVar74;
                  break;
                case -1:
                  dVar67 = 0.0;
                  dVar73 = 0.0;
                }
                dVar76 = dVar67;
                dVar74 = dVar73;
                if (lVar61 == lVar14 + 1) goto switchD_0029946e_caseD_0;
              }
              else {
                dVar73 = dVar74;
                if (lVar61 == lVar14 + 1) {
                  switch(iVar6) {
                  case 1:
                  case 2:
                  case 4:
                    dVar76 = dVar74;
                  default:
switchD_0029946e_caseD_0:
                    dVar73 = dVar74;
                    if ((((iVar6 == 4) || (iVar6 == 2)) &&
                        (dVar76 = dVar74, (uVar52 == 2 && is_velocity) && pdVar46[lVar55] <= 0.0))
                       && (dVar76 = 0.0, dVar73 = 0.0, 0.0 <= dVar74)) {
                      dVar76 = dVar74;
                      dVar73 = dVar74;
                    }
                    break;
                  case 3:
                    dVar76 = dVar67;
                    if (uVar52 == 2 && is_velocity) {
                      dVar73 = dVar67;
                    }
                    break;
                  case -1:
                    dVar76 = 0.0;
                    dVar73 = 0.0;
                  }
                }
              }
              dVar67 = dVar73;
              if ((pdVar46[lVar55] <= 1e-08) && (dVar67 = dVar76, -1e-08 <= pdVar46[lVar55])) {
                dVar67 = (dVar73 + dVar76) * 0.5;
              }
              pdVar59[lVar55] = dVar67;
              lVar55 = lVar55 + 1;
            } while ((iVar4 - iVar7) + 1 != (int)lVar55);
          }
          pdVar46 = pdVar46 + lVar17;
          pdVar59 = pdVar59 + lVar18;
          pdVar63 = pdVar63 + local_1d8;
          pdVar47 = pdVar47 + local_1d8;
          pdVar38 = pdVar38 + local_1d8;
          pdVar57 = pdVar57 + local_1d8;
        }
        pdVar44 = pdVar44 + lVar30;
        pdVar21 = pdVar21 + lVar41;
        iVar28 = iVar28 + 1;
        iVar29 = iVar29 + 1;
        pdVar48 = pdVar48 + local_1b0;
        lVar61 = lVar61 + 1;
      }
      pdVar23 = pdVar23 + lVar42;
      local_228 = local_228 + local_148;
      local_190 = local_190 + local_148;
    }
  }
  else {
    lVar17 = wmac->jstride;
    lVar30 = wmac->kstride;
    iVar1 = (wmac->begin).x;
    iVar2 = (wmac->begin).y;
    uVar50 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar50 = 0;
    }
    iVar3 = (wmac->begin).z;
    lVar18 = zedge->jstride;
    pdVar11 = wmac->p;
    lVar41 = zedge->kstride;
    lVar31 = (lVar15 - lVar42) * local_1d8;
    iVar39 = iVar6 + 1;
    local_e8 = local_190 + (((int)(iVar39 - uVar5) * local_1b0 + lVar31 + lVar45) - lVar61);
    local_140 = local_190 + ((lVar31 + lVar45) - lVar61);
    pdVar44 = local_190 + ((((lVar16 - lVar43) + -1) * local_1b0 + lVar31 + lVar45) - lVar61);
    pdVar23 = local_190 + (((lVar16 - lVar43) * local_1b0 + lVar31 + lVar45) - lVar61);
    local_190 = local_190 + (((int)(iVar29 + uVar27) * local_1b0 + lVar31 + lVar45) - lVar61);
    pdVar48 = zedge->p +
              ((lVar45 + (lVar16 - (zedge->begin).z) * lVar41 + (lVar15 - (zedge->begin).y) * lVar18
               ) - (long)(zedge->begin).x);
    lVar61 = zedge->nstride;
    lVar31 = local_1b0 * 8;
    for (uVar52 = 0; uVar52 != uVar50; uVar52 = uVar52 + 1) {
      pdVar21 = pdVar44;
      pdVar46 = pdVar48;
      pdVar57 = pdVar23;
      lVar42 = lVar16;
      pdVar59 = pdVar11 + ((lVar45 + (lVar16 - iVar3) * lVar30 + (lVar15 - iVar2) * lVar17) -
                          (long)iVar1);
      iVar40 = (iVar8 - uVar5) + -2;
      iVar58 = uVar27 + iVar8;
      iVar28 = iVar8 - uVar5;
      while (iVar28 = iVar28 + 1, lVar42 <= iVar13) {
        local_228 = (double *)(iVar58 * lVar31 + (long)local_140);
        local_198 = (double *)(iVar40 * lVar31 + (long)local_140);
        local_258 = (double *)(iVar28 * lVar31 + (long)local_140);
        iVar24 = (int)lVar42 + -1;
        pdVar38 = pdVar46;
        pdVar47 = pdVar21;
        pdVar63 = local_e8;
        pdVar60 = local_190;
        pdVar62 = pdVar59;
        local_248 = pdVar57;
        for (lVar43 = lVar15; lVar43 <= lVar49; lVar43 = lVar43 + 1) {
          if (iVar7 <= iVar4) {
            iVar9 = d_bcrec_ptr[uVar52].bc[2];
            iVar10 = d_bcrec_ptr[uVar52].bc[5];
            bVar65 = 1 < iVar9 - 3U;
            bVar64 = iVar9 == 4 || iVar10 == 3;
            lVar55 = 0;
            do {
              if (iVar9 == 3 && lVar42 <= lVar32) {
                dVar67 = pdVar60[lVar55];
                goto LAB_00298bf1;
              }
              if (lVar14 < lVar42 && iVar10 == 3) {
                dVar67 = pdVar63[lVar55];
                goto LAB_00298bf1;
              }
              dVar67 = local_248[lVar55];
              dVar72 = pdVar47[lVar55];
              dVar76 = local_258[lVar55];
              if (lVar42 != lVar32 || bVar65) {
                dVar74 = (dVar76 - dVar72) * 0.5;
                if (lVar42 == lVar14 && bVar64) {
                  dVar74 = (dVar76 * 4.0 + dVar67 * -3.0) - dVar72;
                  goto LAB_00298c7f;
                }
              }
              else {
                dVar74 = dVar72 * -4.0 + dVar67 * 3.0 + dVar76;
LAB_00298c7f:
                dVar74 = dVar74 / 3.0;
              }
              dVar70 = (dVar67 - dVar72) + (dVar67 - dVar72);
              dVar87 = (dVar76 - dVar67) + (dVar76 - dVar67);
              dVar76 = ABS(dVar70);
              dVar71 = ABS(dVar87);
              dVar73 = ABS(dVar74);
              if (dVar76 <= ABS(dVar74)) {
                dVar73 = dVar76;
              }
              if (dVar73 <= dVar71) {
                dVar71 = dVar73;
              }
              uVar75 = -(ulong)(0.0 < dVar70 * dVar87) & (ulong)dVar71;
              dVar73 = local_198[lVar55];
              if (iVar29 != iVar24 || bVar65) {
                dVar71 = (dVar67 - dVar73) * 0.5;
                if (bVar64 && iVar6 == iVar24) {
                  dVar71 = (dVar67 * 4.0 + dVar72 * -3.0) - dVar73;
                  goto LAB_00298d68;
                }
              }
              else {
                dVar71 = dVar73 * -4.0 + dVar72 * 3.0 + dVar67;
LAB_00298d68:
                dVar71 = dVar71 / 3.0;
              }
              dVar87 = (double)(~-(ulong)(0.0 < dVar74) & (uVar75 ^ 0x8000000000000000) |
                               -(ulong)(0.0 < dVar74) & uVar75) * -0.5 + dVar67;
              dVar73 = (dVar72 - dVar73) + (dVar72 - dVar73);
              dVar81 = ABS(dVar73);
              dVar74 = ABS(dVar71);
              if (dVar81 <= ABS(dVar71)) {
                dVar74 = dVar81;
              }
              if (dVar74 <= dVar76) {
                dVar76 = dVar74;
              }
              uVar75 = -(ulong)(0.0 < dVar70 * dVar73) & (ulong)dVar76;
              dVar72 = (double)(~-(ulong)(0.0 < dVar71) & (uVar75 ^ 0x8000000000000000) |
                               -(ulong)(0.0 < dVar71) & uVar75) * 0.5 + dVar72;
              if (lVar42 != lVar32) {
                if (lVar42 == iVar39) {
                  switch(iVar10) {
                  case 1:
                  case 2:
                  case 4:
                    dVar87 = dVar72;
                  default:
                    goto LAB_00298eb5;
                  case 3:
                    dVar87 = dVar67;
                    if (uVar52 != 2 || !is_velocity) goto LAB_00298f20;
                    break;
                  case -1:
                    dVar72 = 0.0;
                    dVar87 = 0.0;
                    goto LAB_00298f20;
                  }
                  goto LAB_00298eee;
                }
                goto LAB_00298f20;
              }
              switch(iVar9) {
              case 1:
                dVar72 = dVar87;
                break;
              case 2:
              case 4:
                dVar72 = dVar87;
                if ((uVar52 == 2 && is_velocity) && 0.0 <= pdVar62[lVar55]) {
                  dVar72 = 0.0;
                  if (dVar87 <= 0.0) {
                    dVar72 = dVar87;
                  }
LAB_00298e98:
                  dVar87 = dVar72;
                }
                goto LAB_00298ea9;
              case 3:
                dVar72 = local_228[lVar55];
                if (uVar52 == 2 && is_velocity) goto LAB_00298e98;
                goto LAB_00298ea9;
              case -1:
                dVar72 = 0.0;
                dVar87 = 0.0;
              }
LAB_00298ea9:
              if (lVar42 == iVar39) {
LAB_00298eb5:
                if (((iVar10 == 4) || (iVar10 == 2)) &&
                   (dVar87 = dVar72, (uVar52 == 2 && is_velocity) && pdVar62[lVar55] <= 0.0)) {
                  dVar67 = 0.0;
                  if (0.0 <= dVar72) {
                    dVar67 = dVar72;
                  }
LAB_00298eee:
                  dVar72 = dVar67;
                  dVar87 = dVar72;
                }
              }
LAB_00298f20:
              dVar67 = dVar72;
              if ((pdVar62[lVar55] <= 1e-08) && (dVar67 = dVar87, -1e-08 <= pdVar62[lVar55])) {
                dVar67 = (dVar72 + dVar87) * 0.5;
              }
LAB_00298bf1:
              pdVar38[lVar55] = dVar67;
              lVar55 = lVar55 + 1;
            } while ((iVar4 - iVar7) + 1 != (int)lVar55);
          }
          pdVar62 = pdVar62 + lVar17;
          pdVar38 = pdVar38 + lVar18;
          pdVar63 = pdVar63 + local_1d8;
          local_228 = local_228 + local_1d8;
          local_198 = local_198 + local_1d8;
          local_258 = local_258 + local_1d8;
          pdVar47 = pdVar47 + local_1d8;
          local_248 = local_248 + local_1d8;
          pdVar60 = pdVar60 + local_1d8;
        }
        pdVar59 = pdVar59 + lVar30;
        pdVar46 = pdVar46 + lVar41;
        iVar58 = iVar58 + 1;
        iVar40 = iVar40 + 1;
        pdVar21 = pdVar21 + local_1b0;
        pdVar57 = pdVar57 + local_1b0;
        lVar42 = lVar42 + 1;
      }
      pdVar48 = pdVar48 + lVar61;
      local_e8 = local_e8 + local_148;
      local_140 = local_140 + local_148;
      pdVar44 = pdVar44 + local_148;
      pdVar23 = pdVar23 + local_148;
      local_190 = local_190 + local_148;
    }
  }
  return;
}

Assistant:

void
MOL::ComputeEdgeState (const Box& bx,
                       AMREX_D_DECL( Array4<Real> const& xedge,
                                     Array4<Real> const& yedge,
                                     Array4<Real> const& zedge),
                       Array4<Real const> const& q,
                       const int ncomp,
                       AMREX_D_DECL( Array4<Real const> const& umac,
                                     Array4<Real const> const& vmac,
                                     Array4<Real const> const& wmac),
                       const Box&       domain,
                       const Vector<BCRec>& bcs,
                       const        BCRec * d_bcrec_ptr,
                       bool         is_velocity)
{
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM==3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 0);
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= ubx.bigEnd(0)))
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state_extdir( i, j, k, n, q, umac,
                                                                d_bcrec_ptr,
                                                                domain_ilo, domain_ihi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state( i, j, k, n, q, umac,
                                                         d_bcrec_ptr,
                                                         domain_ilo, domain_ihi,
                                                         is_velocity);
        });
    }

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 1);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi && domain_jhi <= vbx.bigEnd(1)))
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state_extdir( i, j, k, n, q, vmac,
                                                                d_bcrec_ptr,
                                                                domain_jlo, domain_jhi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state( i, j, k, n, q, vmac,
                                                         d_bcrec_ptr,
                                                         domain_jlo, domain_jhi,
                                                         is_velocity);
        });
    }


#if ( AMREX_SPACEDIM ==3 )

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 2);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= wbx.bigEnd(2)))
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state_extdir( i, j, k, n, q, wmac,
                                                                d_bcrec_ptr,
                                                                domain_klo, domain_khi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state( i, j, k, n, q, wmac,
                                                         d_bcrec_ptr,
                                                         domain_klo, domain_khi,
                                                         is_velocity);
        });
    }

#endif
}